

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNamespaceURIFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlNodeSetPtr pxVar2;
  xmlNs *pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr value;
  uint uVar5;
  int iVar6;
  xmlChar *val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    if (nargs != 0) {
      iVar6 = 0xc;
      goto LAB_001bee5d;
    }
    pxVar4 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar4);
  }
  iVar6 = ctxt->valueNr;
  if ((long)iVar6 < 1) {
    iVar6 = 0x17;
  }
  else {
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
       ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
      uVar5 = iVar6 - 1;
      ctxt->valueNr = uVar5;
      ppxVar1 = ctxt->valueTab;
      if (iVar6 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ppxVar1[(long)iVar6 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ppxVar1[uVar5];
      ppxVar1[uVar5] = (xmlXPathObjectPtr)0x0;
      pxVar2 = pxVar4->nodesetval;
      if ((((pxVar2 == (xmlNodeSetPtr)0x0) || (pxVar2->nodeNr == 0)) ||
          (1 < (*pxVar2->nodeTab)->type - XML_ELEMENT_NODE)) ||
         (pxVar3 = (*pxVar2->nodeTab)->ns, pxVar3 == (xmlNs *)0x0)) {
        val = "";
      }
      else {
        val = pxVar3->href;
      }
      value = xmlXPathCacheNewString(ctxt,val);
      xmlXPathValuePush(ctxt,value);
      xmlXPathReleaseObject(ctxt->context,pxVar4);
      return;
    }
    iVar6 = 0xb;
  }
LAB_001bee5d:
  xmlXPathErr(ctxt,iVar6);
  return;
}

Assistant:

void
xmlXPathNamespaceURIFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
	nargs = 1;
    }
    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	    if (cur->nodesetval->nodeTab[i]->ns == NULL)
		xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	    else
		xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			  cur->nodesetval->nodeTab[i]->ns->href));
	    break;
	default:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}